

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

long * __thiscall
google::protobuf::RepeatedField<long>::elements(RepeatedField<long> *this,bool is_soo)

{
  string *psVar1;
  long *plVar2;
  undefined7 in_register_00000031;
  int v1;
  LogMessageFatal local_20 [16];
  
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    v1 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  else {
    v1 = 1;
  }
  psVar1 = absl::lts_20240722::log_internal::Check_GTImpl_abi_cxx11_(v1,0,"Capacity(is_soo) > 0");
  if (psVar1 == (string *)0x0) {
    if (is_soo) {
      return (long *)((long)&(this->soo_rep_).field_0 + 8);
    }
    plVar2 = (long *)internal::LongSooRep::elements((LongSooRep *)this);
    return plVar2;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
             ,0x246,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }